

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

Float __thiscall
pbrt::ExhaustiveLightSampler::PDF
          (ExhaustiveLightSampler *this,LightSampleContext *ctx,LightHandle *light)

{
  LightBounds *pLVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  float fVar7;
  Float FVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM4 [16];
  Point3f p;
  
  auVar10 = in_ZMM0._0_16_;
  bVar4 = HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
          ::HasKey(&this->lightToBoundedIndex,light);
  if (bVar4) {
    fVar7 = 0.0;
    fVar9 = 0.0;
    lVar6 = 0;
    for (uVar5 = 0; uVar5 < (this->boundedLights).nStored; uVar5 = uVar5 + 1) {
      pLVar1 = (this->lightBounds).ptr;
      p = LightSampleContext::p(ctx);
      FVar8 = LightBounds::Importance
                        ((LightBounds *)
                         ((long)&(pLVar1->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar6),
                         p,(Normal3f)(ctx->n).super_Tuple3<pbrt::Normal3,_float>);
      bVar4 = (light->
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              ).bits == (this->boundedLights).ptr[uVar5].
                        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                        .bits;
      fVar9 = fVar9 + FVar8;
      lVar6 = lVar6 + 0x34;
      fVar7 = (float)((uint)bVar4 * (int)FVar8 + (uint)!bVar4 * (int)fVar7);
    }
    sVar2 = (this->infiniteLights).nStored;
    auVar10 = vcvtusi2ss_avx512f(in_XMM4,sVar2);
    auVar3 = vcvtusi2ss_avx512f(in_XMM4,(sVar2 + 1) - (ulong)((this->lightBounds).nStored == 0));
    fVar9 = (1.0 - auVar10._0_4_ / auVar3._0_4_) * (fVar7 / fVar9);
  }
  else {
    auVar10 = vcvtusi2ss_avx512f(auVar10,((this->infiniteLights).nStored + 1) -
                                         (ulong)((this->lightBounds).nStored == 0));
    fVar9 = 1.0 / auVar10._0_4_;
  }
  return fVar9;
}

Assistant:

Float ExhaustiveLightSampler::PDF(const LightSampleContext &ctx,
                                  LightHandle light) const {
    if (!lightToBoundedIndex.HasKey(light))
        return 1.f / (infiniteLights.size() + (!lightBounds.empty() ? 1 : 0));

    Float importanceSum = 0;
    Float lightImportance = 0;
    for (size_t i = 0; i < boundedLights.size(); ++i) {
        Float importance = lightBounds[i].Importance(ctx.p(), ctx.n);
        importanceSum += importance;
        if (light == boundedLights[i])
            lightImportance = importance;
    }
    Float pInfinite = Float(infiniteLights.size()) /
                      Float(infiniteLights.size() + (!lightBounds.empty() ? 1 : 0));
    Float pdf = lightImportance / importanceSum * (1. - pInfinite);
    return pdf;
}